

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

BindDirectiveSyntax * __thiscall
slang::parsing::Parser::parseBindDirective(Parser *this,AttrList attr)

{
  SyntaxNode **ppSVar1;
  bool bVar2;
  int iVar3;
  SyntaxNode *this_00;
  NameSyntax *pNVar4;
  undefined4 extraout_var;
  BindTargetListSyntax *targetInstances;
  HierarchyInstantiationSyntax *instantiation;
  BindDirectiveSyntax *pBVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  EVP_PKEY_CTX *src;
  Token bind;
  SourceRange range;
  Token TVar7;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> names;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  long local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_a8 [2];
  
  _Var6 = attr._M_extent._M_extent_value;
  bind = ParserBase::consume(&this->super_ParserBase);
  this_00 = (SyntaxNode *)parseName(this);
  bVar2 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar2) {
    if (this_00->kind != IdentifierName) {
      range = syntax::SyntaxNode::sourceRange(this_00);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x30005,range);
    }
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    ppSVar1 = &local_a8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
    local_a8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
    local_a8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
    local_a8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x4;
    local_a8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)ppSVar1;
    while( true ) {
      pNVar4 = parseName(this);
      local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar4;
      local_d0._0_1_ = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                 (TokenOrSyntax *)&local_e0._M_first);
      bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
      if (!bVar2) break;
      local_e0._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase)
      ;
      local_d0 = (ulong)local_d0._1_7_ << 8;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                 (TokenOrSyntax *)&local_e0._M_first);
    }
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    local_b8 = CONCAT44(extraout_var,iVar3);
    local_e0._8_4_ = 3;
    local_d0 = 0;
    uStack_c8 = 0;
    local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f8998;
    targetInstances =
         syntax::SyntaxFactory::bindTargetList
                   (&this->factory,TVar7,
                    (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&local_e0._M_first);
    if ((SyntaxNode **)local_a8[0].super_SyntaxListBase._vptr_SyntaxListBase != ppSVar1) {
      operator_delete(local_a8[0].super_SyntaxListBase._vptr_SyntaxListBase);
    }
  }
  else {
    targetInstances = (BindTargetListSyntax *)0x0;
  }
  (this->meta).hasBindDirectives = true;
  bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
  local_a8[0].super_SyntaxListBase.childCount = _Var6._M_extent_value;
  local_a8[0].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attr._M_ptr;
  local_a8[0].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent
  ._M_extent_value = _Var6._M_extent_value;
  if (bVar2) {
    TVar7 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar7.kind == DoubleColon) {
      TVar7 = ParserBase::peek(&this->super_ParserBase,2);
      if (TVar7.kind == Identifier) {
        local_a8[0].super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_a8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_a8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_a8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f85e0
        ;
        instantiation =
             (HierarchyInstantiationSyntax *)parseCheckerInstantiation(this,(AttrList)ZEXT816(0));
        goto LAB_001dae50;
      }
    }
  }
  local_a8[0].super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_a8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f85e0;
  instantiation = parseHierarchyInstantiation(this,(AttrList)ZEXT816(0));
LAB_001dae50:
  pBVar5 = syntax::SyntaxFactory::bindDirective
                     (&this->factory,local_a8,bind,(NameSyntax *)this_00,targetInstances,
                      &instantiation->super_MemberSyntax);
  return pBVar5;
}

Assistant:

BindDirectiveSyntax& Parser::parseBindDirective(AttrList attr) {
    Token keyword = consume();
    auto& target = parseName();

    BindTargetListSyntax* targetInstances = nullptr;
    if (peek(TokenKind::Colon)) {
        if (target.kind != SyntaxKind::IdentifierName)
            addDiag(diag::BindDirectiveInvalidName, target.sourceRange());

        auto colon = consume();

        SmallVector<TokenOrSyntax, 4> names;
        while (true) {
            names.push_back(&parseName());
            if (!peek(TokenKind::Comma))
                break;

            names.push_back(consume());
        }

        targetInstances = &factory.bindTargetList(colon, names.copy(alloc));
    }

    meta.hasBindDirectives = true;

    if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::DoubleColon &&
        peek(2).kind == TokenKind::Identifier) {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseCheckerInstantiation({}));
    }
    else {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseHierarchyInstantiation({}));
    }
}